

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O2

_Bool history_is_artifact_known(player *p,artifact *artifact)

{
  size_t sVar1;
  long lVar2;
  _Bool _Var3;
  long lVar4;
  size_t sVar5;
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-history.c"
                  ,0x90,"_Bool history_is_artifact_known(struct player *, const struct artifact *)")
    ;
  }
  sVar1 = (p->hist).next;
  lVar2 = sVar1 * 0x5c;
  do {
    lVar4 = lVar2;
    sVar5 = sVar1;
    if (sVar5 == 0) break;
    _Var3 = flag_has_dbg((p->hist).entries[-1].type + lVar4,2,3,"h->entries[i].type",
                         "HIST_ARTIFACT_KNOWN");
    sVar1 = sVar5 - 1;
    lVar2 = lVar4 + -0x5c;
  } while ((!_Var3) || (artifact->aidx != (uint)(p->hist).entries[-1].type[lVar4 + 6]));
  return sVar5 != 0;
}

Assistant:

bool history_is_artifact_known(struct player *p, const struct artifact *artifact)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	assert(artifact);

	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_KNOWN) &&
				h->entries[i].a_idx == artifact->aidx)
			return true;
	}

	return false;
}